

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<Function>::moveAppend
          (QGenericArrayOps<Function> *this,Function *b,Function *e)

{
  Function *pFVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    pFVar1 = (this->super_QArrayDataPointer<Function>).ptr;
    qVar5 = (this->super_QArrayDataPointer<Function>).size;
    do {
      pDVar2 = (b->className).d.d;
      (b->className).d.d = (Data *)0x0;
      pFVar1[qVar5].className.d.d = pDVar2;
      pcVar3 = (b->className).d.ptr;
      (b->className).d.ptr = (char16_t *)0x0;
      pFVar1[qVar5].className.d.ptr = pcVar3;
      qVar4 = (b->className).d.size;
      (b->className).d.size = 0;
      pFVar1[qVar5].className.d.size = qVar4;
      pDVar2 = (b->functionName).d.d;
      (b->functionName).d.d = (Data *)0x0;
      pFVar1[qVar5].functionName.d.d = pDVar2;
      pcVar3 = (b->functionName).d.ptr;
      (b->functionName).d.ptr = (char16_t *)0x0;
      pFVar1[qVar5].functionName.d.ptr = pcVar3;
      qVar4 = (b->functionName).d.size;
      (b->functionName).d.size = 0;
      pFVar1[qVar5].functionName.d.size = qVar4;
      pDVar2 = (b->functionParameters).d.d;
      (b->functionParameters).d.d = (Data *)0x0;
      pFVar1[qVar5].functionParameters.d.d = pDVar2;
      pcVar3 = (b->functionParameters).d.ptr;
      (b->functionParameters).d.ptr = (char16_t *)0x0;
      pFVar1[qVar5].functionParameters.d.ptr = pcVar3;
      qVar4 = (b->functionParameters).d.size;
      (b->functionParameters).d.size = 0;
      pFVar1[qVar5].functionParameters.d.size = qVar4;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<Function>).size + 1;
      (this->super_QArrayDataPointer<Function>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }